

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void initMain(void)

{
  Parameters p;
  bool in_stack_ffffffffffffff3f;
  atomic<bool> *in_stack_ffffffffffffff40;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff48;
  anon_class_1_0_00000001 *__f;
  _Any_data *this;
  anon_class_1_0_00000001 local_70 [92];
  _Any_data local_14;
  
  std::atomic<bool>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  this = &local_14;
  GGSock::FileServer::Parameters::Parameters((Parameters *)this);
  local_14._0_4_ = 2;
  GGSock::FileServer::init((Parameters *)&g_fileServer);
  std::function<void(short)>::function<initMain()::__0,void>
            ((function<void_(short)> *)this,in_stack_ffffffffffffff48);
  GGSock::Communicator::setErrorCallback((function *)&g_fileClient);
  std::function<void_(short)>::~function((function<void_(short)> *)0x176c00);
  __f = local_70;
  std::function<unsigned_short(char_const*,unsigned_int)>::function<initMain()::__1,void>
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)this,__f);
  GGSock::Communicator::setMessageCallback(0x6830,(function *)0x65);
  std::function<unsigned_short_(const_char_*,_unsigned_int)>::~function
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x176c36);
  std::function<unsigned_short(char_const*,unsigned_int)>::function<initMain()::__2,void>
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)this,__f);
  GGSock::Communicator::setMessageCallback(0x6830,(function *)0x67);
  std::function<unsigned_short_(const_char_*,_unsigned_int)>::~function
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x176c6c);
  return;
}

Assistant:

void initMain() {
    g_isRunning = true;

    GGSock::FileServer::Parameters p;
#ifdef __EMSCRIPTEN__
    p.nWorkerThreads = 0;
#else
    p.nWorkerThreads = 2;
#endif
    g_fileServer.init(p);

    g_fileClient.setErrorCallback([](GGSock::Communicator::TErrorCode code) {
        printf("Disconnected with code = %d\n", code);

        g_hasReceivedFileInfos = false;
        g_hasRequestedFileInfos = false;
        g_hasReceivedFiles = false;
    });

    g_fileClient.setMessageCallback(GGSock::FileServer::MsgFileInfosResponse, [&](const char * dataBuffer, size_t dataSize) {
        printf("Received message %d, size = %d\n", GGSock::FileServer::MsgFileInfosResponse, (int) dataSize);

        size_t offset = 0;
        GGSock::Unserialize()(g_receivedFileInfos, dataBuffer, dataSize, offset);

        for (const auto & info : g_receivedFileInfos) {
            printf("    - %s : %s (size = %d, chunks = %d)\n", info.second.uri.c_str(), info.second.filename.c_str(), (int) info.second.filesize, (int) info.second.nChunks);
            g_receivedFiles[info.second.uri].info = info.second;
            g_receivedFiles[info.second.uri].data.resize(info.second.filesize);

            g_receivedFileInfosExtended[info.second.uri] = {};
        }

        g_hasReceivedFileInfos = true;

        return 0;
    });

    g_fileClient.setMessageCallback(GGSock::FileServer::MsgFileChunkResponse, [&](const char * dataBuffer, size_t dataSize) {
        GGSock::FileServer::FileChunkResponseData data;

        size_t offset = 0;
        GGSock::Unserialize()(data, dataBuffer, dataSize, offset);

        //printf("Received chunk %d for file '%s', size = %d\n", data.chunkId, data.uri.c_str(), (int) data.data.size());
        std::memcpy(g_receivedFiles[data.uri].data.data() + data.pStart, data.data.data(), data.pLen);

        g_receivedFileInfosExtended[data.uri].nReceivedChunks++;
        g_receivedFileInfosExtended[data.uri].nRequestedChunks--;
        g_receivedFileInfosExtended[data.uri].isChunkReceived[data.chunkId] = true;

        return 0;
    });
}